

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::on_torrent_aborted(torrent *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 auStack_38 [24];
  element_type *peStack_20;
  
  storage_holder::reset(&this->m_storage);
  iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  get_handle((torrent *)auStack_38);
  auStack_38._16_8_ = (this->m_userdata).m_type_ptr;
  peStack_20 = (element_type *)(this->m_userdata).m_client_ptr;
  alert_manager::
  emplace_alert<libtorrent::torrent_removed_alert,libtorrent::torrent_handle,libtorrent::info_hash_t_const&,libtorrent::client_data_t>
            ((alert_manager *)CONCAT44(extraout_var,iVar1),(torrent_handle *)auStack_38,
             &this->m_info_hash,(client_data_t *)(auStack_38 + 0x10));
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 8));
  return;
}

Assistant:

void torrent::on_torrent_aborted()
	{
		TORRENT_ASSERT(is_single_thread());

		// there should be no more disk activity for this torrent now, we can
		// release the disk io handle
		m_storage.reset();

		alerts().emplace_alert<torrent_removed_alert>(get_handle()
			, info_hash(), get_userdata());
	}